

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec4 *pIVar3;
  float local_44;
  float fStack_40;
  ImVec4 current;
  ImVec4 cr;
  bool intersect_with_current_clip_rect_local;
  ImDrawList *this_local;
  ImVec2 cr_max_local;
  ImVec2 cr_min_local;
  
  cr_max_local.x = cr_min.x;
  cr_max_local.y = cr_min.y;
  this_local._0_4_ = cr_max.x;
  this_local._4_4_ = cr_max.y;
  ImVec4::ImVec4((ImVec4 *)&current.z,cr_max_local.x,cr_max_local.y,this_local._0_4_,
                 this_local._4_4_);
  if ((intersect_with_current_clip_rect) && ((this->_ClipRectStack).Size != 0)) {
    pIVar3 = (this->_ClipRectStack).Data + ((this->_ClipRectStack).Size + -1);
    uVar1 = pIVar3->x;
    uVar2 = pIVar3->y;
    current.x = pIVar3->z;
    current.y = pIVar3->w;
    if (current.z < (float)uVar1) {
      current.z = (float)uVar1;
    }
    if (current.w < (float)uVar2) {
      current.w = (float)uVar2;
    }
    if (current.x < cr.x) {
      cr.x = current.x;
    }
    if (current.y < cr.y) {
      cr.y = current.y;
    }
  }
  ImMax<float>(current.z,cr.x);
  ImMax<float>(current.w,cr.y);
  ImVector<ImVec4>::push_back(&this->_ClipRectStack,(ImVec4 *)&current.z);
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}